

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

shared_ptr<mocker::ast::WhileStmt> __thiscall
mocker::Parser::whileStmt(Parser *this,TokIter *iter,TokIter end)

{
  Token *pTVar1;
  long lVar2;
  Position end_00;
  undefined8 uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> pVar5;
  pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> pVar6;
  size_t sVar7;
  TokenID TVar8;
  TokenID TVar9;
  mapped_type *pmVar10;
  CompileError *this_00;
  Token *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  bool bVar12;
  shared_ptr<mocker::ast::WhileStmt> sVar13;
  Position beg;
  Position beg_00;
  Position end_01;
  shared_ptr<mocker::ast::Statement> body;
  shared_ptr<mocker::ast::Expression> condition;
  undefined1 local_78 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> local_50;
  size_t local_48;
  TokIter *local_40;
  size_t local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  
  Token::position(*end._M_current);
  sVar7 = local_48;
  pVar5 = local_50;
  _Var11._M_pi = extraout_RDX;
  if ((*end._M_current == in_RCX) ||
     (TVar8 = Token::tokenID(*end._M_current), _Var11._M_pi = extraout_RDX_00, TVar8 != While)) {
    (this->tokBeg)._M_current = (Token *)0x0;
    (this->tokEnd)._M_current = (Token *)0x0;
    goto LAB_0018369b;
  }
  lVar2 = *(long *)end._M_current;
  pTVar1 = (Token *)(lVar2 + 0x38);
  *(Token **)end._M_current = pTVar1;
  condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(long *)end._M_current = lVar2 + 0x70;
  if (pTVar1 == in_RCX) {
    TVar8 = Error;
  }
  else {
    TVar8 = Token::tokenID(pTVar1);
  }
  bVar12 = true;
  if (TVar8 == LeftParen) {
    local_50 = (pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>)logicalOrExpr;
    local_48 = 0;
    local_78._0_8_ = (Token *)0x2f;
    local_40 = iter;
    auxBinaryExpr<std::_Bind<std::shared_ptr<mocker::ast::Expression>(mocker::Parser::*(mocker::Parser*,std::_Placeholder<1>,std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>&,__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>)>>
              ((Parser *)(local_78 + 0x10),iter,end,
               (_Bind<std::shared_ptr<mocker::ast::Expression>_(mocker::Parser::*(mocker::Parser_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>_&,___gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>)>
                *)in_RCX,&local_50);
    p_Var4 = p_Stack_60;
    condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_78._16_8_;
    _Var11 = condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
    local_78._16_8_ =
         (unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
          *)0x0;
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var4;
    if (_Var11._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var11._M_pi);
    }
    TVar9 = Error;
    if (condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pTVar1 = *end._M_current;
      *(Token **)end._M_current = pTVar1 + 1;
      if (pTVar1 != in_RCX) {
        TVar9 = Token::tokenID(pTVar1);
      }
      if (TVar9 != RightParen) goto LAB_0018360d;
      statement((Parser *)local_78,iter,end);
      uVar3 = local_78._0_8_;
      body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_78._0_8_;
      body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_;
      local_78._8_8_ = (Token *)0x0;
      local_78._0_8_ = (Token *)0x0;
      bVar12 = (Token *)uVar3 == (Token *)0x0;
      TVar9 = Identifier;
    }
  }
  else {
LAB_0018360d:
    TVar9 = Error;
  }
  if (((char)TVar9 != '\0') && ((Token *)local_78._8_8_ != (Token *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  if ((TVar8 == LeftParen) && (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
  }
  if (bVar12) {
    this_00 = (CompileError *)__cxa_allocate_exception(0x48);
    Token::position(*end._M_current);
    pVar6 = local_50;
    end_00.col = local_38;
    end_00.line = (size_t)local_40;
    beg_00.col = sVar7;
    local_50.first = pVar5.first;
    local_50.second = pVar5.second;
    beg_00.line._0_4_ = local_50.first;
    beg_00.line._4_4_ = local_50.second;
    local_50 = pVar6;
    CompileError::CompileError(this_00,beg_00,end_00);
    *(undefined ***)this_00 = &PTR__CompileError_001f2a98;
    __cxa_throw(this_00,&SyntaxError::typeinfo,CompileError::~CompileError);
  }
  local_50 = (pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>)
             body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pmVar10 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)iter[2]._M_current,(key_type *)&local_50);
  pVar6 = local_50;
  local_50.first = pVar5.first;
  local_50.second = pVar5.second;
  beg.col._0_4_ = local_50.first;
  beg.col._4_4_ = local_50.second;
  beg.line = (size_t)iter;
  end_01.col = (pmVar10->second).line;
  end_01.line = sVar7;
  local_50 = pVar6;
  sVar13 = makeNode<mocker::ast::WhileStmt,std::shared_ptr<mocker::ast::Expression>&,std::shared_ptr<mocker::ast::Statement>&>
                     (this,beg,end_01,(shared_ptr<mocker::ast::Expression> *)(pmVar10->second).col,
                      (shared_ptr<mocker::ast::Statement> *)&condition);
  _Var11 = sVar13.super___shared_ptr<mocker::ast::WhileStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var11._M_pi = extraout_RDX_01;
  }
  if (condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var11._M_pi = extraout_RDX_02;
  }
LAB_0018369b:
  sVar13.super___shared_ptr<mocker::ast::WhileStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  sVar13.super___shared_ptr<mocker::ast::WhileStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::WhileStmt>)
         sVar13.super___shared_ptr<mocker::ast::WhileStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::WhileStmt> Parser::whileStmt(TokIter &iter, TokIter end) {
  auto begPos = iter->position().first;
  auto id = GetTokenID(end);

  if (id(iter) != TokenID::While)
    return nullptr;
  ++iter;
  std::shared_ptr<ast::Expression> condition;
  std::shared_ptr<ast::Statement> body;
  if (id(iter++) != TokenID::LeftParen ||
      !(condition = expression(iter, end)) ||
      id(iter++) != TokenID::RightParen || !(body = statement(iter, end)))
    throw SyntaxError(begPos, iter->position().second);
  return makeNode<ast::WhileStmt>(begPos, pos[body->getID()].second, condition,
                                  body);
}